

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O3

int expression_tree::sequential::
    evaluate<int,expression_tree::no_caching,expression_tree::sequential>
              (operation<int> *o,
              node<int,_expression_tree::no_caching,_expression_tree::sequential> *l,
              node<int,_expression_tree::no_caching,_expression_tree::sequential> *r)

{
  int iVar1;
  int local_18;
  int local_14;
  
  local_14 = (*((l->impl)._M_t.
                super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
                .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>.
               _M_head_impl)->_vptr_node_impl[4])();
  iVar1 = (*((r->impl)._M_t.
             super___uniq_ptr_impl<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_expression_tree::detail::node_impl<int>_*,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
             .super__Head_base<0UL,_expression_tree::detail::node_impl<int>_*,_false>._M_head_impl)
            ->_vptr_node_impl[4])();
  _local_18 = CONCAT44(local_14,iVar1);
  if ((o->super__Function_base)._M_manager != (_Manager_type)0x0) {
    iVar1 = (*o->_M_invoker)((_Any_data *)o,&local_14,&local_18);
    return iVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

static T evaluate(const detail::operation<T>& o, const node<T, C, E>& l, const node<T, C, E>& r)
	{
		return o(l.evaluate(), r.evaluate());
	}